

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BasicBlock * __thiscall FlowGraph::SetBlockTargetAndLoopFlag(FlowGraph *this,LabelInstr *labelInstr)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  
  pBVar3 = labelInstr->m_block;
  if (pBVar3 == (BasicBlock *)0x0) {
    pBVar3 = BasicBlock::New(this);
    if ((pBVar3 != (BasicBlock *)0x0) && (labelInstr->m_block != (BasicBlock *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                         "Overwriting existing block pointer");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    labelInstr->m_block = pBVar3;
  }
  if ((labelInstr->field_0x78 & 1) != 0) {
    pBVar3->field_0x18 = pBVar3->field_0x18 | 4;
    this->hasLoop = true;
  }
  return pBVar3;
}

Assistant:

BasicBlock *
FlowGraph::SetBlockTargetAndLoopFlag(IR::LabelInstr * labelInstr)
{
    BasicBlock * blockTarget = nullptr;
    blockTarget = labelInstr->GetBasicBlock();

    if (blockTarget == nullptr)
    {
        blockTarget = BasicBlock::New(this);
        labelInstr->SetBasicBlock(blockTarget);
    }
    if (labelInstr->m_isLoopTop)
    {
        blockTarget->isLoopHeader = true;
        this->hasLoop = true;
    }

    return blockTarget;
}